

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_edge_offset_class3_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  byte bVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 *in_R8;
  byte *in_R9;
  byte *in_stack_00000008;
  char *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  WORD8 *pi1_sao_offset;
  WORD32 edge_idx_2;
  WORD32 edge_idx_1;
  WORD32 edge_idx;
  UWORD8 u1_pos_0_ht_tmp_v;
  UWORD8 u1_pos_0_ht_tmp_u;
  UWORD8 u1_pos_wd_0_tmp_v;
  UWORD8 u1_pos_wd_0_tmp_u;
  WORD32 bit_depth;
  WORD8 u1_sign_down;
  UWORD8 *pu1_src_left_cpy;
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_left_tmp [2];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [128];
  UWORD8 au1_mask [64];
  WORD32 col;
  WORD32 row;
  int local_278;
  int local_268;
  int local_258;
  int local_248;
  char local_230;
  uint local_228;
  uint local_220;
  long local_218;
  char local_1fc;
  uint local_1f8;
  uint local_1f0;
  char local_1e8;
  uint local_1e4;
  uint local_1dc;
  char local_1d4;
  uint local_1d0;
  uint local_1c8;
  char local_1c0;
  uint local_1bc;
  uint local_1b4;
  char local_19c;
  char local_19b;
  char local_19a;
  char local_199;
  long local_190;
  char acStack_188 [78];
  undefined1 local_13a;
  undefined1 local_139;
  undefined1 auStack_138 [64];
  undefined1 auStack_f8 [128];
  byte local_78 [64];
  int local_38;
  int local_34;
  byte *local_30;
  undefined1 *local_28;
  long local_20;
  long local_18;
  int local_c;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0xff,0x40);
  local_13a = *(undefined1 *)(local_20 + (in_stack_00000028 + -2));
  local_139 = *(undefined1 *)(local_20 + (in_stack_00000028 + -1));
  for (local_34 = 0; local_34 < in_stack_00000030; local_34 = local_34 + 1) {
    auStack_f8[local_34 << 1] =
         *(undefined1 *)(local_8 + (local_34 * local_c + in_stack_00000028 + -2));
    auStack_f8[local_34 * 2 + 1] =
         *(undefined1 *)(local_8 + (local_34 * local_c + in_stack_00000028 + -1));
  }
  for (local_38 = 0; local_38 < in_stack_00000028; local_38 = local_38 + 1) {
    auStack_138[local_38] =
         *(undefined1 *)(local_8 + ((in_stack_00000030 + -1) * local_c + local_38));
  }
  if (in_stack_00000010[5] == '\0') {
    local_199 = *(char *)(local_8 + (in_stack_00000028 + -2));
    local_19a = *(char *)(local_8 + (in_stack_00000028 + -1));
  }
  else {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) - (uint)*local_30) < 0) {
      local_1b4 = 0xffffffff;
    }
    else {
      local_1b4 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) -
                                  (uint)*local_30));
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) -
             (uint)*(byte *)(local_8 + (in_stack_00000028 + -4 + local_c))) < 0) {
      local_1bc = 0xffffffff;
    }
    else {
      local_1bc = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) -
                                  (uint)*(byte *)(local_8 + (in_stack_00000028 + -4 + local_c))));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1b4 + 2 + local_1bc)];
    if (iVar2 == 0) {
      local_199 = *(char *)(local_8 + (in_stack_00000028 + -2));
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) +
               (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) +
                 (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_1c0 = '\0';
        }
        else {
          local_1c0 = *(char *)(local_8 + (in_stack_00000028 + -2)) +
                      *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_1c0 = -1;
      }
      local_199 = local_1c0;
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) - (uint)local_30[1]) < 0) {
      local_1c8 = 0xffffffff;
    }
    else {
      local_1c8 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) -
                                  (uint)local_30[1]));
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) -
             (uint)*(byte *)(local_8 + (in_stack_00000028 + -3 + local_c))) < 0) {
      local_1d0 = 0xffffffff;
    }
    else {
      local_1d0 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) -
                                  (uint)*(byte *)(local_8 + (in_stack_00000028 + -3 + local_c))));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1c8 + 2 + local_1d0)];
    if (iVar2 == 0) {
      local_19a = *(char *)(local_8 + (in_stack_00000028 + -1));
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) +
               (int)*(char *)(in_stack_00000020 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) +
                 (int)*(char *)(in_stack_00000020 + iVar2)) < 0) {
          local_1d4 = '\0';
        }
        else {
          local_1d4 = *(char *)(local_8 + (in_stack_00000028 + -1)) +
                      *(char *)(in_stack_00000020 + iVar2);
        }
      }
      else {
        local_1d4 = -1;
      }
      local_19a = local_1d4;
    }
  }
  if (in_stack_00000010[6] == '\0') {
    local_19b = *(char *)(local_8 + (in_stack_00000030 + -1) * local_c);
    local_19c = *(char *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1));
  }
  else {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) -
             (uint)*(byte *)(local_8 + (((in_stack_00000030 + -1) * local_c + 2) - local_c))) < 0) {
      local_1dc = 0xffffffff;
    }
    else {
      local_1dc = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) -
                                  (uint)*(byte *)(local_8 +
                                                 (((in_stack_00000030 + -1) * local_c + 2) - local_c
                                                 ))));
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) -
             (uint)*in_stack_00000008) < 0) {
      local_1e4 = 0xffffffff;
    }
    else {
      local_1e4 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) -
                                  (uint)*in_stack_00000008));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1dc + 2 + local_1e4)];
    if (iVar2 == 0) {
      local_19b = *(char *)(local_8 + (in_stack_00000030 + -1) * local_c);
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) +
               (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + (in_stack_00000030 + -1) * local_c) +
                 (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_1e8 = '\0';
        }
        else {
          local_1e8 = *(char *)(local_8 + (in_stack_00000030 + -1) * local_c) +
                      *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_1e8 = -1;
      }
      local_19b = local_1e8;
    }
    if ((int)((uint)*(byte *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1)) -
             (uint)*(byte *)(local_8 + (((in_stack_00000030 + -1) * local_c + 3) - local_c))) < 0) {
      local_1f0 = 0xffffffff;
    }
    else {
      local_1f0 = (uint)(0 < (int)((uint)*(byte *)(local_8 +
                                                  ((in_stack_00000030 + -1) * local_c + 1)) -
                                  (uint)*(byte *)(local_8 +
                                                 (((in_stack_00000030 + -1) * local_c + 3) - local_c
                                                 ))));
    }
    if ((int)((uint)*(byte *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1)) -
             (uint)in_stack_00000008[1]) < 0) {
      local_1f8 = 0xffffffff;
    }
    else {
      local_1f8 = (uint)(0 < (int)((uint)*(byte *)(local_8 +
                                                  ((in_stack_00000030 + -1) * local_c + 1)) -
                                  (uint)in_stack_00000008[1]));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1f0 + 2 + local_1f8)];
    if (iVar2 == 0) {
      local_19c = *(char *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1));
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1)) +
               (int)*(char *)(in_stack_00000020 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1)) +
                 (int)*(char *)(in_stack_00000020 + iVar2)) < 0) {
          local_1fc = '\0';
        }
        else {
          local_1fc = *(char *)(local_8 + ((in_stack_00000030 + -1) * local_c + 1)) +
                      *(char *)(in_stack_00000020 + iVar2);
        }
      }
      else {
        local_1fc = -1;
      }
      local_19c = local_1fc;
    }
  }
  if (*in_stack_00000010 == '\0') {
    local_78[0] = 0;
  }
  if (in_stack_00000010[2] == '\0') {
    local_8 = local_8 + local_c;
    in_stack_00000030 = in_stack_00000030 + -1;
    local_190 = in_RDX + 2;
    for (local_38 = 0; local_38 < in_stack_00000028 + -2; local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) -
               (uint)*(byte *)(local_8 + ((local_38 + 2) - local_c))) < 0) {
        cVar3 = -1;
      }
      else {
        cVar3 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_8 + ((local_38 + 2) - local_c)));
      }
      acStack_188[local_38] = cVar3;
    }
  }
  else {
    for (local_38 = 0; local_190 = in_RDX, local_38 < in_stack_00000028 + -2;
        local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) - (uint)*(byte *)(local_20 + (local_38 + 2))) <
          0) {
        cVar3 = -1;
      }
      else {
        cVar3 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_20 + (local_38 + 2)));
      }
      acStack_188[local_38] = cVar3;
    }
  }
  if (in_stack_00000010[1] == '\0') {
    local_78[in_stack_00000028 + -1 >> 1] = 0;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000030 = in_stack_00000030 + -1;
  }
  for (local_34 = 0; local_34 < in_stack_00000030; local_34 = local_34 + 1) {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) -
             (uint)*(byte *)(local_8 + (in_stack_00000028 - local_c))) < 0) {
      cVar3 = -1;
    }
    else {
      cVar3 = 0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -2)) -
                       (uint)*(byte *)(local_8 + (in_stack_00000028 - local_c)));
    }
    acStack_188[in_stack_00000028 + -2] = cVar3;
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) -
             (uint)*(byte *)(local_8 + ((in_stack_00000028 + 1) - local_c))) < 0) {
      cVar3 = -1;
    }
    else {
      cVar3 = 0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1)) -
                       (uint)*(byte *)(local_8 + ((in_stack_00000028 + 1) - local_c)));
    }
    acStack_188[in_stack_00000028 + -1] = cVar3;
    for (local_38 = 0; local_38 < in_stack_00000028; local_38 = local_38 + 1) {
      if (local_38 % 2 == 0) {
        local_218 = in_stack_00000018;
      }
      else {
        local_218 = in_stack_00000020;
      }
      if (local_38 < 2) {
        bVar1 = *(byte *)(local_190 + ((local_34 + 1) * 2 + local_38));
      }
      else {
        bVar1 = *(byte *)(local_8 + (local_38 + -2 + local_c));
      }
      local_220 = (uint)bVar1;
      if ((int)(*(byte *)(local_8 + local_38) - local_220) < 0) {
        cVar3 = -1;
      }
      else {
        if (local_38 < 2) {
          bVar1 = *(byte *)(local_190 + ((local_34 + 1) * 2 + local_38));
        }
        else {
          bVar1 = *(byte *)(local_8 + (local_38 + -2 + local_c));
        }
        local_228 = (uint)bVar1;
        cVar3 = 0 < (int)(*(byte *)(local_8 + local_38) - local_228);
      }
      lVar5 = (long)local_38;
      if (1 < local_38) {
        acStack_188[local_38 + -2] = -cVar3;
      }
      uVar4 = gi4_ihevc_table_edge_idx[acStack_188[lVar5] + 2 + (int)cVar3] &
              (uint)local_78[local_38 >> 1];
      if (uVar4 != 0) {
        if ((int)((uint)*(byte *)(local_8 + local_38) + (int)*(char *)(local_218 + (int)uVar4)) <
            0x100) {
          if ((int)((uint)*(byte *)(local_8 + local_38) + (int)*(char *)(local_218 + (int)uVar4)) <
              0) {
            local_230 = '\0';
          }
          else {
            local_230 = *(char *)(local_8 + local_38) + *(char *)(local_218 + (int)uVar4);
          }
        }
        else {
          local_230 = -1;
        }
        *(char *)(local_8 + local_38) = local_230;
      }
    }
    local_8 = local_8 + local_c;
  }
  if (in_stack_00000010[2] == '\0') {
    local_248 = in_stack_00000030 + 1;
  }
  else {
    local_248 = in_stack_00000030;
  }
  *(char *)(local_8 + (-local_248 * local_c + in_stack_00000028 + -2)) = local_199;
  if (in_stack_00000010[2] == '\0') {
    local_258 = in_stack_00000030 + 1;
  }
  else {
    local_258 = in_stack_00000030;
  }
  *(char *)(local_8 + (-local_258 * local_c + in_stack_00000028 + -1)) = local_19a;
  if (in_stack_00000010[3] == '\0') {
    local_268 = 0;
  }
  else {
    local_268 = -local_c;
  }
  *(char *)(local_8 + local_268) = local_19b;
  if (in_stack_00000010[3] == '\0') {
    local_278 = 0;
  }
  else {
    local_278 = -local_c;
  }
  *(char *)(local_8 + (local_278 + 1)) = local_19c;
  if (in_stack_00000010[2] == '\0') {
    in_stack_00000030 = in_stack_00000030 + 1;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000030 = in_stack_00000030 + 1;
  }
  *local_28 = local_13a;
  local_28[1] = local_139;
  for (local_34 = 0;
      SBORROW4(local_34,in_stack_00000030 * 2) != local_34 + in_stack_00000030 * -2 < 0;
      local_34 = local_34 + 1) {
    *(undefined1 *)(local_18 + local_34) = auStack_f8[local_34];
  }
  for (local_38 = 0; local_38 < in_stack_00000028; local_38 = local_38 + 1) {
    *(undefined1 *)(local_20 + local_38) = auStack_138[local_38];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[2 * MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_top_left_tmp[2];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_wd_0_tmp_u;
    UWORD8 u1_pos_wd_0_tmp_v;
    UWORD8 u1_pos_0_ht_tmp_u;
    UWORD8 u1_pos_0_ht_tmp_v;

    bit_depth = BIT_DEPTH_CHROMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    au1_src_top_left_tmp[0] = pu1_src_top[wd - 2];
    au1_src_top_left_tmp[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[2 * row] = pu1_src[row * src_strd + wd - 2];
        au1_src_left_tmp[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[wd - 2] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_u = CLIP3(pu1_src[wd - 2] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[1]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_v = CLIP3(pu1_src[wd - 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_u = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src[(ht - 1) * src_strd + 1 + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src_bot_left[1]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_v = CLIP3(pu1_src[(ht - 1) * src_strd + 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
        }
    }
    else
    {
        u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 2;
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 2 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 2]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[(wd - 1) >> 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 2] = SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 + 2 - src_strd]);
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 2 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - ((col < 2) ? pu1_src_left_cpy[2 * (row + 1) + col] :
                                                                pu1_src[col - 2 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 1)
                    au1_sign_up[col - 2] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 2] = u1_pos_wd_0_tmp_u;
        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp_v;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp_u;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0) + 1] = u1_pos_0_ht_tmp_v;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    pu1_src_top_left[0] = au1_src_top_left_tmp[0];
    pu1_src_top_left[1] = au1_src_top_left_tmp[1];
    for(row = 0; row < 2 * ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}